

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

ptls_hash_context_t * sha384_clone(ptls_hash_context_t *_src)

{
  sha384_context_t *src;
  sha384_context_t *dst;
  ptls_hash_context_t *_src_local;
  
  _src_local = (ptls_hash_context_t *)malloc(0xf0);
  if (_src_local == (ptls_hash_context_t *)0x0) {
    _src_local = (ptls_hash_context_t *)0x0;
  }
  else {
    memcpy(_src_local,_src,0xf0);
  }
  return _src_local;
}

Assistant:

static int sign_certificate(ptls_sign_certificate_t *_self, ptls_t *tls, uint16_t *selected_algorithm, ptls_buffer_t *outbuf,
                            ptls_iovec_t input, const uint16_t *algorithms, size_t num_algorithms)
{
    ptls_openssl_sign_certificate_t *self = (ptls_openssl_sign_certificate_t *)_self;
    const struct st_ptls_openssl_signature_scheme_t *scheme;

    /* select the algorithm */
    for (scheme = self->schemes; scheme->scheme_id != UINT16_MAX; ++scheme) {
        size_t i;
        for (i = 0; i != num_algorithms; ++i)
            if (algorithms[i] == scheme->scheme_id)
                goto Found;
    }
    return PTLS_ALERT_HANDSHAKE_FAILURE;

Found:
    *selected_algorithm = scheme->scheme_id;
    return do_sign(self->key, outbuf, input, scheme->scheme_md);
}